

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::release_resources(HL1MDLLoader *this)

{
  int local_14;
  int i;
  HL1MDLLoader *this_local;
  
  if (this->buffer_ != this->texture_buffer_) {
    if (this->texture_buffer_ != (uchar *)0x0) {
      operator_delete__(this->texture_buffer_);
    }
    this->texture_buffer_ = (uchar *)0x0;
  }
  if ((this->num_sequence_groups_ != 0) && (this->anim_buffers_ != (uchar **)0x0)) {
    for (local_14 = 1; local_14 < this->num_sequence_groups_; local_14 = local_14 + 1) {
      if (this->anim_buffers_[local_14] != (uchar *)0x0) {
        if (this->anim_buffers_[local_14] != (uchar *)0x0) {
          operator_delete__(this->anim_buffers_[local_14]);
        }
        this->anim_buffers_[local_14] = (uchar *)0x0;
      }
    }
    if (this->anim_buffers_ != (uchar **)0x0) {
      operator_delete__(this->anim_buffers_);
    }
    this->anim_buffers_ = (uchar **)0x0;
  }
  if (this->anim_headers_ != (SequenceHeader_HL1 **)0x0) {
    if (this->anim_headers_ != (SequenceHeader_HL1 **)0x0) {
      operator_delete__(this->anim_headers_);
    }
    this->anim_headers_ = (SequenceHeader_HL1 **)0x0;
  }
  return;
}

Assistant:

void HL1MDLLoader::release_resources() {
    if (buffer_ != texture_buffer_) {
        delete[] texture_buffer_;
        texture_buffer_ = nullptr;
    }

    if (num_sequence_groups_ && anim_buffers_) {
        for (int i = 1; i < num_sequence_groups_; ++i) {
            if (anim_buffers_[i]) {
                delete[] anim_buffers_[i];
                anim_buffers_[i] = nullptr;
            }
        }

        delete[] anim_buffers_;
        anim_buffers_ = nullptr;
    }

    if (anim_headers_) {
        delete[] anim_headers_;
        anim_headers_ = nullptr;
    }
}